

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profile.hpp
# Opt level: O0

bool __thiscall
ruckig::Profile::
check_for_second_order<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)7>
          (Profile *this,double aUp,double aDown,double vMax,double vMin)

{
  value_type_conflict2 vVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  reference pvVar7;
  reference pvVar8;
  array<double,_8UL> *paVar9;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  bool local_181;
  double local_140;
  double local_138;
  double local_130;
  double local_120;
  double local_110;
  double local_100;
  ulong local_d0;
  size_t i_1;
  double vLowLim;
  double vUppLim;
  undefined8 local_b0;
  double local_a8;
  undefined8 local_a0;
  double local_98;
  undefined8 local_90;
  double local_88;
  double local_80;
  undefined1 local_78 [56];
  ulong local_40;
  size_t i;
  double vMin_local;
  double vMax_local;
  double aDown_local;
  double aUp_local;
  Profile *this_local;
  
  i = (size_t)vMin;
  vMin_local = vMax;
  vMax_local = aDown;
  aDown_local = aUp;
  aUp_local = (double)this;
  pvVar7 = std::array<double,_7UL>::operator[](&this->t,0);
  if (0.0 < *pvVar7 || *pvVar7 == 0.0) {
    pvVar7 = std::array<double,_7UL>::operator[](&this->t,0);
    vVar1 = *pvVar7;
    pvVar7 = std::array<double,_7UL>::operator[](&this->t_sum,0);
    *pvVar7 = vVar1;
    for (local_40 = 0; local_40 < 6; local_40 = local_40 + 1) {
      pvVar7 = std::array<double,_7UL>::operator[](&this->t,local_40 + 1);
      if (*pvVar7 <= 0.0 && *pvVar7 != 0.0) {
        return false;
      }
      pvVar7 = std::array<double,_7UL>::operator[](&this->t_sum,local_40);
      dVar2 = *pvVar7;
      pvVar7 = std::array<double,_7UL>::operator[](&this->t,local_40 + 1);
      dVar3 = *pvVar7;
      pvVar7 = std::array<double,_7UL>::operator[](&this->t_sum,local_40 + 1);
      *pvVar7 = dVar2 + dVar3;
    }
    pvVar7 = std::array<double,_7UL>::back(&this->t_sum);
    if (*pvVar7 <= 1000000000000.0) {
      memset(local_78,0,0x38);
      memcpy(local_78,&DAT_00161410,0x38);
      memcpy(&this->j,local_78,0x38);
      pvVar7 = std::array<double,_7UL>::operator[](&this->t,0);
      if (*pvVar7 <= 0.0) {
        local_100 = 0.0;
      }
      else {
        local_100 = aDown_local;
      }
      vUppLim = local_100;
      local_b0 = 0;
      pvVar7 = std::array<double,_7UL>::operator[](&this->t,2);
      if (*pvVar7 <= 0.0) {
        local_110 = 0.0;
      }
      else {
        local_110 = vMax_local;
      }
      local_a8 = local_110;
      local_a0 = 0;
      pvVar7 = std::array<double,_7UL>::operator[](&this->t,4);
      if (*pvVar7 <= 0.0) {
        local_120 = 0.0;
      }
      else {
        local_120 = vMax_local;
      }
      local_98 = local_120;
      local_90 = 0;
      pvVar7 = std::array<double,_7UL>::operator[](&this->t,6);
      if (*pvVar7 <= 0.0) {
        local_130 = 0.0;
      }
      else {
        local_130 = aDown_local;
      }
      local_88 = local_130;
      local_80 = this->af;
      memcpy(&this->a,&vUppLim,0x40);
      this->direction = (uint)(vMin_local <= 0.0);
      if (this->direction == UP) {
        local_138 = vMin_local;
      }
      else {
        local_138 = (double)i;
      }
      local_138 = local_138 + 1e-12;
      if (this->direction == UP) {
        local_140 = (double)i;
      }
      else {
        local_140 = vMin_local;
      }
      local_140 = local_140 - 1e-12;
      for (local_d0 = 0; local_d0 < 7; local_d0 = local_d0 + 1) {
        pvVar8 = std::array<double,_8UL>::operator[](&this->v,local_d0);
        dVar2 = *pvVar8;
        pvVar7 = std::array<double,_7UL>::operator[](&this->t,local_d0);
        dVar3 = *pvVar7;
        pvVar8 = std::array<double,_8UL>::operator[](&this->a,local_d0);
        dVar4 = *pvVar8;
        pvVar8 = std::array<double,_8UL>::operator[](&this->v,local_d0 + 1);
        *pvVar8 = dVar3 * dVar4 + dVar2;
        pvVar8 = std::array<double,_8UL>::operator[](&this->p,local_d0);
        dVar2 = *pvVar8;
        pvVar7 = std::array<double,_7UL>::operator[](&this->t,local_d0);
        dVar3 = *pvVar7;
        pvVar8 = std::array<double,_8UL>::operator[](&this->v,local_d0);
        dVar4 = *pvVar8;
        pvVar7 = std::array<double,_7UL>::operator[](&this->t,local_d0);
        dVar5 = *pvVar7;
        pvVar8 = std::array<double,_8UL>::operator[](&this->a,local_d0);
        dVar6 = *pvVar8;
        pvVar8 = std::array<double,_8UL>::operator[](&this->p,local_d0 + 1);
        *pvVar8 = dVar3 * (dVar4 + (dVar5 * dVar6) / 2.0) + dVar2;
      }
      this->control_signs = UDDU;
      this->limits = NONE;
      paVar9 = &this->p;
      std::array<double,_8UL>::back(paVar9);
      std::abs((int)paVar9);
      local_181 = false;
      if (extraout_XMM0_Qa < 1e-08) {
        paVar9 = &this->v;
        std::array<double,_8UL>::back(paVar9);
        std::abs((int)paVar9);
        local_181 = false;
        if (extraout_XMM0_Qa_00 < 1e-08) {
          pvVar8 = std::array<double,_8UL>::operator[](&this->v,2);
          local_181 = false;
          if (*pvVar8 <= local_138) {
            pvVar8 = std::array<double,_8UL>::operator[](&this->v,3);
            local_181 = false;
            if (*pvVar8 <= local_138) {
              pvVar8 = std::array<double,_8UL>::operator[](&this->v,4);
              local_181 = false;
              if (*pvVar8 <= local_138) {
                pvVar8 = std::array<double,_8UL>::operator[](&this->v,5);
                local_181 = false;
                if (*pvVar8 <= local_138) {
                  pvVar8 = std::array<double,_8UL>::operator[](&this->v,6);
                  local_181 = false;
                  if (*pvVar8 <= local_138) {
                    pvVar8 = std::array<double,_8UL>::operator[](&this->v,2);
                    local_181 = false;
                    if (local_140 <= *pvVar8) {
                      pvVar8 = std::array<double,_8UL>::operator[](&this->v,3);
                      local_181 = false;
                      if (local_140 <= *pvVar8) {
                        pvVar8 = std::array<double,_8UL>::operator[](&this->v,4);
                        local_181 = false;
                        if (local_140 <= *pvVar8) {
                          pvVar8 = std::array<double,_8UL>::operator[](&this->v,5);
                          local_181 = false;
                          if (local_140 <= *pvVar8) {
                            pvVar8 = std::array<double,_8UL>::operator[](&this->v,6);
                            local_181 = local_140 <= *pvVar8;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      this_local._7_1_ = local_181;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool check_for_second_order(double aUp, double aDown, double vMax, double vMin) {
        if (t[0] < 0) {
            return false;
        }

        t_sum[0] = t[0];
        for (size_t i = 0; i < 6; ++i) {
            if (t[i+1] < 0) {
                return false;
            }

            t_sum[i+1] = t_sum[i] + t[i+1];
        }

        if (t_sum.back() > t_max) { // For numerical reasons, is that needed?
            return false;
        }

        j = {0, 0, 0, 0, 0, 0, 0};
        if constexpr (control_signs == ControlSigns::UDDU) {
            a = {(t[0] > 0 ? aUp : 0), 0, (t[2] > 0 ? aDown : 0), 0, (t[4] > 0 ? aDown : 0), 0, (t[6] > 0 ? aUp : 0), af};
        } else {
            a = {(t[0] > 0 ? aUp : 0), 0, (t[2] > 0 ? aDown : 0), 0, (t[4] > 0 ? aUp : 0), 0, (t[6] > 0 ? aDown : 0), af};
        }

        direction = (vMax > 0) ? Profile::Direction::UP : Profile::Direction::DOWN;
        const double vUppLim = (direction == Profile::Direction::UP ? vMax : vMin) + v_eps;
        const double vLowLim = (direction == Profile::Direction::UP ? vMin : vMax) - v_eps;

        for (size_t i = 0; i < 7; ++i) {
            v[i+1] = v[i] + t[i] * a[i];
            p[i+1] = p[i] + t[i] * (v[i] + t[i] * a[i] / 2);
        }

        this->control_signs = control_signs;
        this->limits = limits;

        // Velocity limit can be broken in the beginning if both initial velocity and acceleration are too high
        // std::cout << std::setprecision(16) << "target: " << std::abs(p.back() - pf) << " " << std::abs(v.back() - vf) << " " << std::abs(a.back() - af) << " T: " << t_sum.back() << " " << to_string() << std::endl;
        return std::abs(p.back() - pf) < p_precision && std::abs(v.back() - vf) < v_precision
            && v[2] <= vUppLim && v[3] <= vUppLim && v[4] <= vUppLim && v[5] <= vUppLim && v[6] <= vUppLim
            && v[2] >= vLowLim && v[3] >= vLowLim && v[4] >= vLowLim && v[5] >= vLowLim && v[6] >= vLowLim;
    }